

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid2d_refinement_pattern_tests.cc
# Opt level: O3

void __thiscall
lf::refinement::test::TopRefTest_TopQuadRef_Test::TestBody(TopRefTest_TopQuadRef_Test *this)

{
  ostream *poVar1;
  int anchor_1;
  int anchor;
  sub_idx_t sVar2;
  char *pcVar3;
  double dVar4;
  lt_polys_t child_polygons;
  Hybrid2DRefinementPattern rp;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  AssertHelper local_88;
  internal local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_70;
  Hybrid2DRefinementPattern local_58;
  _func_int **local_38;
  
  local_58.super_RefinementPattern.ref_el_.type_ = kQuad;
  local_58.super_RefinementPattern.lattice_const_ = 6;
  local_58.super_RefinementPattern._vptr_RefinementPattern = (_func_int **)&PTR_NumChildren_003f5be8
  ;
  local_58.anchor_ = 0xffffffff;
  local_58.ref_pat_ = rp_copy;
  local_58.anchor_set_ = false;
  Hybrid2DRefinementPattern::ChildPolygons(&local_70,&local_58,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"COPY: ",6);
  PrintLatticePolygons((ostream *)&std::cout,&local_70);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Area = ",7);
  SumTwiceAreaPolygons(&local_70);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_88.data_._0_4_ = SumTwiceAreaPolygons(&local_70);
  dVar4 = (double)local_58.super_RefinementPattern.lattice_const_ *
          (double)local_58.super_RefinementPattern.lattice_const_;
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(dVar4 + dVar4);
  testing::internal::CmpHelperEQ<unsigned_int,double>
            (local_80,"SumTwiceAreaPolygons(child_polygons)","2 * std::pow(rp.LatticeConst(), 2)",
             (uint *)&local_88,(double *)&local_90);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/hybrid2d_refinement_pattern_tests.cc"
               ,0xb4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  local_38 = (_func_int **)&PTR_NumChildren_003f5be8;
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  std::
  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector(&local_70);
  sVar2 = 0;
  do {
    Hybrid2DRefinementPattern::Hybrid2DRefinementPattern(&local_58,(RefEl)0x4,rp_trisect,sVar2);
    Hybrid2DRefinementPattern::ChildPolygons(&local_70,&local_58,0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TRISECT(anchor=",0xf);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") : ",4);
    PrintLatticePolygons(poVar1,&local_70);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Area = ",7);
    SumTwiceAreaPolygons(&local_70);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    local_88.data_._0_4_ = SumTwiceAreaPolygons(&local_70);
    dVar4 = (double)local_58.super_RefinementPattern.lattice_const_ *
            (double)local_58.super_RefinementPattern.lattice_const_;
    local_90._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(dVar4 + dVar4);
    testing::internal::CmpHelperEQ<unsigned_int,double>
              (local_80,"SumTwiceAreaPolygons(child_polygons)","2 * std::pow(rp.LatticeConst(), 2)",
               (uint *)&local_88,(double *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_90);
      pcVar3 = "";
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/hybrid2d_refinement_pattern_tests.cc"
                 ,0xbf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    std::
    vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&local_70);
    sVar2 = sVar2 + 1;
  } while (sVar2 != 4);
  sVar2 = 0;
  do {
    Hybrid2DRefinementPattern::Hybrid2DRefinementPattern(&local_58,(RefEl)0x4,rp_quadsect,sVar2);
    Hybrid2DRefinementPattern::ChildPolygons(&local_70,&local_58,0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"QUADSECT(anchor=",0x10);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") : ",4);
    PrintLatticePolygons(poVar1,&local_70);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Area = ",7);
    SumTwiceAreaPolygons(&local_70);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    local_88.data_._0_4_ = SumTwiceAreaPolygons(&local_70);
    dVar4 = (double)local_58.super_RefinementPattern.lattice_const_ *
            (double)local_58.super_RefinementPattern.lattice_const_;
    local_90._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(dVar4 + dVar4);
    testing::internal::CmpHelperEQ<unsigned_int,double>
              (local_80,"SumTwiceAreaPolygons(child_polygons)","2 * std::pow(rp.LatticeConst(), 2)",
               (uint *)&local_88,(double *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_90);
      pcVar3 = "";
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/hybrid2d_refinement_pattern_tests.cc"
                 ,0xca,pcVar3);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    std::
    vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&local_70);
    sVar2 = sVar2 + 1;
  } while (sVar2 != 4);
  sVar2 = 0;
  do {
    Hybrid2DRefinementPattern::Hybrid2DRefinementPattern(&local_58,(RefEl)0x4,rp_split,sVar2);
    Hybrid2DRefinementPattern::ChildPolygons(&local_70,&local_58,0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Split(anchor=",0xd);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") : ",4);
    PrintLatticePolygons(poVar1,&local_70);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Area = ",7);
    SumTwiceAreaPolygons(&local_70);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    local_88.data_._0_4_ = SumTwiceAreaPolygons(&local_70);
    dVar4 = (double)local_58.super_RefinementPattern.lattice_const_ *
            (double)local_58.super_RefinementPattern.lattice_const_;
    local_90._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(dVar4 + dVar4);
    testing::internal::CmpHelperEQ<unsigned_int,double>
              (local_80,"SumTwiceAreaPolygons(child_polygons)","2 * std::pow(rp.LatticeConst(), 2)",
               (uint *)&local_88,(double *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_90);
      pcVar3 = "";
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/hybrid2d_refinement_pattern_tests.cc"
                 ,0xd5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    std::
    vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&local_70);
    sVar2 = sVar2 + 1;
  } while (sVar2 != 4);
  sVar2 = 0;
  do {
    Hybrid2DRefinementPattern::Hybrid2DRefinementPattern(&local_58,(RefEl)0x4,rp_threeedge,sVar2);
    Hybrid2DRefinementPattern::ChildPolygons(&local_70,&local_58,0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"THREEEDGE(anchor=",0x11);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") : ",4);
    PrintLatticePolygons(poVar1,&local_70);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Area = ",7);
    SumTwiceAreaPolygons(&local_70);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    local_88.data_._0_4_ = SumTwiceAreaPolygons(&local_70);
    dVar4 = (double)local_58.super_RefinementPattern.lattice_const_ *
            (double)local_58.super_RefinementPattern.lattice_const_;
    local_90._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(dVar4 + dVar4);
    testing::internal::CmpHelperEQ<unsigned_int,double>
              (local_80,"SumTwiceAreaPolygons(child_polygons)","2 * std::pow(rp.LatticeConst(), 2)",
               (uint *)&local_88,(double *)&local_90);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_90);
      pcVar3 = "";
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/hybrid2d_refinement_pattern_tests.cc"
                 ,0xe0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90._M_head_impl + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    std::
    vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&local_70);
    sVar2 = sVar2 + 1;
  } while (sVar2 != 4);
  local_58.super_RefinementPattern.ref_el_.type_ = kQuad;
  local_58.super_RefinementPattern.lattice_const_ = 6;
  local_58.super_RefinementPattern._vptr_RefinementPattern = local_38;
  local_58.anchor_ = 0xffffffff;
  local_58.ref_pat_ = rp_regular;
  local_58.anchor_set_ = false;
  Hybrid2DRefinementPattern::ChildPolygons(&local_70,&local_58,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BARYCENTRIC: ",0xd);
  PrintLatticePolygons((ostream *)&std::cout,&local_70);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Area = ",7);
  SumTwiceAreaPolygons(&local_70);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_88.data_._0_4_ = SumTwiceAreaPolygons(&local_70);
  dVar4 = (double)local_58.super_RefinementPattern.lattice_const_ *
          (double)local_58.super_RefinementPattern.lattice_const_;
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(dVar4 + dVar4);
  testing::internal::CmpHelperEQ<unsigned_int,double>
            (local_80,"SumTwiceAreaPolygons(child_polygons)","2 * std::pow(rp.LatticeConst(), 2)",
             (uint *)&local_88,(double *)&local_90);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/test/hybrid2d_refinement_pattern_tests.cc"
               ,0xe9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  std::
  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector(&local_70);
  return;
}

Assistant:

TEST(TopRefTest, TopQuadRef) {
  // Check the various refinements
  {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kQuad(), RefPat::rp_copy);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "COPY: " << child_polygons << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              2 * std::pow(rp.LatticeConst(), 2));
  }
  for (int anchor = 0; anchor < 4; anchor++) {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kQuad(), RefPat::rp_trisect,
                                 anchor);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "TRISECT(anchor=" << anchor << ") : " << child_polygons
              << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              2 * std::pow(rp.LatticeConst(), 2));
  }
  for (int anchor = 0; anchor < 4; anchor++) {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kQuad(), RefPat::rp_quadsect,
                                 anchor);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "QUADSECT(anchor=" << anchor << ") : " << child_polygons
              << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              2 * std::pow(rp.LatticeConst(), 2));
  }
  for (int anchor = 0; anchor < 4; anchor++) {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kQuad(), RefPat::rp_split,
                                 anchor);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "Split(anchor=" << anchor << ") : " << child_polygons
              << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              2 * std::pow(rp.LatticeConst(), 2));
  }
  for (int anchor = 0; anchor < 4; anchor++) {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kQuad(), RefPat::rp_threeedge,
                                 anchor);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "THREEEDGE(anchor=" << anchor << ") : " << child_polygons
              << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              2 * std::pow(rp.LatticeConst(), 2));
  }
  {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kQuad(), RefPat::rp_regular);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "BARYCENTRIC: " << child_polygons << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              2 * std::pow(rp.LatticeConst(), 2));
  }
}